

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleSlice.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  char *pcVar2;
  Value *sub;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attribute;
  string_view attribute_00;
  Slice s;
  Slice ss;
  ValueLength len;
  Slice sss;
  Builder b;
  Value local_160;
  Value local_150;
  long local_140 [2];
  Value local_130;
  Value local_120;
  Builder local_110;
  Value local_58;
  Value local_48;
  Value local_38;
  Value local_28;
  int __fd;
  
  arangodb::velocypack::Builder::Builder(&local_110);
  arangodb::velocypack::Value::Value(&local_150,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_110,&local_150);
  local_160._valueType = Int;
  local_160._cType = Int64;
  local_160._value.d = 5.92878775009496e-323;
  attrName._M_str = "b";
  attrName._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_110,attrName,&local_160);
  local_120._valueType = Bool;
  local_120._cType = 1;
  local_120._value.b = true;
  attrName_00._M_str = "a";
  attrName_00._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_110,attrName_00,&local_120);
  arangodb::velocypack::Value::Value(&local_130,Array,false);
  attrName_01._M_str = "l";
  attrName_01._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_110,attrName_01,&local_130);
  local_28._valueType = Int;
  local_28._cType = Int64;
  local_28._value.d = 4.94065645841247e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_110,&local_28);
  local_38._valueType = Int;
  local_38._cType = Int64;
  local_38._value.d = 9.88131291682493e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_110,&local_38);
  sub = &local_48;
  local_48._valueType = Int;
  local_48._cType = Int64;
  local_48._value.d = 1.48219693752374e-323;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_110,sub);
  arangodb::velocypack::Builder::close(&local_110,(int)sub);
  local_58._valueType = String;
  local_58._cType = CharPtr;
  local_58._value.d = 5.5452445892284e-318;
  attrName_02._M_str = "name";
  attrName_02._M_len = 4;
  __fd = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_110,attrName_02,&local_58);
  arangodb::velocypack::Builder::close(&local_110,__fd);
  local_160._0_8_ = arangodb::velocypack::Builder::start(&local_110);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Slice: ",7);
  poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_160);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  poVar1 = operator<<((ostream *)&std::cout,
                      arangodb::velocypack::SliceStaticData::TypeMap[*(byte *)local_160._0_8_]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bytesize: ",10);
  if ("\x01\x01"[*(byte *)local_160._0_8_] == '\0') {
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                    &local_160,(uint8_t *)local_160._0_8_);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Members: ",9);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_160);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (arangodb::velocypack::SliceStaticData::TypeMap[*(byte *)local_160._0_8_] == Object) {
    attribute._M_str = "l";
    attribute._M_len = 1;
    local_150._0_8_ =
         arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
         get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_160,
             attribute);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Length of .l: ",0xe);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    length((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_150);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Second entry of .l:",0x13);
    local_120._0_8_ =
         arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
         at((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_150,1);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    getInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_120);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  attribute_00._M_str = "name";
  attribute_00._M_len = 4;
  local_120._0_8_ =
       arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
       get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_160,
           attribute_00);
  if ((ulong)*(byte *)local_120._0_8_ - 0x40 < 0x80) {
    pcVar2 = arangodb::velocypack::
             SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &local_120,(ValueLength *)&local_130);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name in .name: ",0xf);
    local_150._0_8_ = local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,pcVar2,pcVar2 + local_130._0_8_);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_150._0_8_,local_150._value.i);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
  }
  arangodb::velocypack::Builder::~Builder(&local_110);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with attributes "b", "a", "l" and "name"
  // note that the attribute names will be sorted in the target VPack object!
  Builder b;

  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  if (s.isObject()) {
    Slice ss = s.get("l");  // Now ss points to the subvalue under "l"
    std::cout << "Length of .l: " << ss.length() << std::endl;
    std::cout << "Second entry of .l:" << ss.at(1).getInt() << std::endl;
  }

  Slice sss = s.get("name");
  if (sss.isString()) {
    ValueLength len;
    char const* st = sss.getString(len);
    std::cout << "Name in .name: " << std::string(st, checkOverflow(len))
              << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}